

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadSegs<mapseg4_t>(MapData *map)

{
  seg_t *psVar1;
  ushort uVar2;
  vertex_t *pvVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  DWORD DVar6;
  int iVar7;
  int b;
  uint uVar8;
  void *__s;
  ulong uVar9;
  void *buffer;
  mapseg4_t *this;
  badseg *pbVar10;
  line_t *plVar11;
  double amt;
  badseg *bad;
  TVector2<double> local_138;
  undefined1 local_128 [32];
  TAngle<double> local_108;
  DVector2 delta;
  undefined1 local_e8 [32];
  double local_c8;
  double dis;
  DAngle delta_angle;
  DAngle seg_angle;
  undefined1 local_a0 [32];
  DAngle ptp_angle;
  line_t *ldef;
  int linedef;
  int side;
  mapseg4_t *ml;
  seg_t *li;
  int lumplen;
  int vnum2;
  int vnum1;
  line_t *line;
  DWORD segangle;
  BYTE *vertchanged;
  BYTE *data;
  int i;
  MapData *map_local;
  
  __s = operator_new__((long)numvertexes);
  DVar6 = MapData::Size(map,5);
  memset(__s,0,(long)numvertexes);
  numsegs = (int)((ulong)(long)(int)DVar6 >> 4);
  if (numsegs == 0) {
    Printf("This map has no segs.\n");
    if (subsectors != (subsector_t *)0x0) {
      operator_delete__(subsectors);
    }
    if (nodes != (node_t *)0x0) {
      operator_delete__(nodes);
    }
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
    ForceNodeBuild = true;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)numsegs;
    uVar9 = SUB168(auVar4 * ZEXT816(0x48),0);
    if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    segs = (seg_t *)operator_new__(uVar9);
    memset(segs,0,(long)numsegs * 0x48);
    buffer = operator_new__((long)(int)DVar6);
    MapData::Read(map,5,buffer,-1);
    for (data._4_4_ = 0; data._4_4_ < numsubsectors; data._4_4_ = data._4_4_ + 1) {
      subsectors[data._4_4_].firstline = segs + (long)subsectors[data._4_4_].firstline;
    }
    _vnum2 = lines;
    for (data._4_4_ = 0; data._4_4_ < numlines; data._4_4_ = data._4_4_ + 1) {
      *(undefined1 *)((long)__s + ((long)_vnum2->v2 - (long)vertexes) / 0x38) = 1;
      *(undefined1 *)((long)__s + ((long)_vnum2->v1 - (long)vertexes) / 0x38) = 1;
      _vnum2 = _vnum2 + 1;
    }
    for (data._4_4_ = 0; data._4_4_ < numsegs; data._4_4_ = data._4_4_ + 1) {
      psVar1 = segs + data._4_4_;
      this = (mapseg4_t *)((long)buffer + (long)data._4_4_ * 0x10);
      iVar7 = mapseg4_t::V1(this);
      b = mapseg4_t::V2(this);
      if ((numvertexes <= iVar7) || (numvertexes <= b)) {
        pbVar10 = (badseg *)__cxa_allocate_exception(0xc);
        iVar7 = MAX<int>(iVar7,b);
        badseg::badseg(pbVar10,0,data._4_4_,iVar7);
        __cxa_throw(pbVar10,&badseg::typeinfo,0);
      }
      psVar1->v1 = vertexes + iVar7;
      psVar1->v2 = vertexes + b;
      uVar2 = this->angle;
      vertex_t::fPos((vertex_t *)local_a0);
      vertex_t::fPos((vertex_t *)&seg_angle);
      TVector2<double>::operator-
                ((TVector2<double> *)(local_a0 + 0x10),(TVector2<double> *)local_a0);
      TVector2<double>::Angle((TVector2<double> *)&stack0xffffffffffffff80);
      amt = AngleToFloat((uint)uVar2 << 0x10);
      TAngle<double>::TAngle(&delta_angle,amt);
      absangle<double>((TAngle<double> *)&dis,(TAngle<double> *)&stack0xffffffffffffff80);
      bVar5 = TAngle<double>::operator>=((TAngle<double> *)&dis,1.0);
      if (bVar5) {
        vertex_t::fPos((vertex_t *)local_e8);
        vertex_t::fPos((vertex_t *)&delta.Y);
        TVector2<double>::operator-
                  ((TVector2<double> *)(local_e8 + 0x10),(TVector2<double> *)local_e8);
        local_c8 = TVector2<double>::Length((TVector2<double> *)(local_e8 + 0x10));
        TAngle<double>::ToVector(&local_108,local_c8);
        if ((iVar7 < b) && (*(char *)((long)__s + (long)b) == '\0')) {
          pvVar3 = psVar1->v2;
          vertex_t::fPos((vertex_t *)local_128);
          TVector2<double>::operator+
                    ((TVector2<double> *)(local_128 + 0x10),(TVector2<double> *)local_128);
          vertex_t::set(pvVar3,(DVector2 *)(local_128 + 0x10));
          *(undefined1 *)((long)__s + (long)b) = 1;
        }
        else if (*(char *)((long)__s + (long)iVar7) == '\0') {
          pvVar3 = psVar1->v1;
          vertex_t::fPos((vertex_t *)&bad);
          TVector2<double>::operator-(&local_138,(TVector2<double> *)&bad);
          vertex_t::set(pvVar3,&local_138);
          *(undefined1 *)((long)__s + (long)iVar7) = 1;
        }
      }
      uVar8 = (uint)this->linedef;
      if ((uint)numlines <= uVar8) {
        pbVar10 = (badseg *)__cxa_allocate_exception(0xc);
        badseg::badseg(pbVar10,1,data._4_4_,uVar8);
        __cxa_throw(pbVar10,&badseg::typeinfo,0);
      }
      plVar11 = lines + (int)uVar8;
      psVar1->linedef = plVar11;
      uVar8 = (uint)this->side;
      if ((uint)numsides <= (uint)(((long)plVar11->sidedef[(int)uVar8] - (long)sides) / 0xd8)) {
        pbVar10 = (badseg *)__cxa_allocate_exception(0xc);
        badseg::badseg(pbVar10,2,data._4_4_,
                       (int)((ulong)((long)plVar11->sidedef[(int)uVar8] - (long)sides) >> 3) *
                       0x684bda13);
        __cxa_throw(pbVar10,&badseg::typeinfo,0);
      }
      psVar1->sidedef = plVar11->sidedef[(int)uVar8];
      psVar1->frontsector = plVar11->sidedef[(int)uVar8]->sector;
      if (((plVar11->flags & 4) == 0) || (plVar11->sidedef[(int)(uVar8 ^ 1)] == (side_t *)0x0)) {
        psVar1->backsector = (sector_t *)0x0;
        plVar11->flags = plVar11->flags & 0xfffffffb;
      }
      else {
        psVar1->backsector = plVar11->sidedef[(int)(uVar8 ^ 1)]->sector;
      }
    }
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
    if (buffer != (void *)0x0) {
      operator_delete__(buffer);
    }
  }
  return;
}

Assistant:

void P_LoadSegs (MapData * map)
{
	int  i;
	BYTE *data;
	BYTE *vertchanged = new BYTE[numvertexes];	// phares 10/4/98
	DWORD segangle;
	line_t* line;		// phares 10/4/98
	//int ptp_angle;		// phares 10/4/98
	//int delta_angle;	// phares 10/4/98
	int vnum1,vnum2;	// phares 10/4/98
	int lumplen = map->Size(ML_SEGS);

	memset (vertchanged,0,numvertexes); // phares 10/4/98

	numsegs = lumplen / sizeof(segtype);

	if (numsegs == 0)
	{
		Printf ("This map has no segs.\n");
		delete[] subsectors;
		delete[] nodes;
		delete[] vertchanged;
		ForceNodeBuild = true;
		return;
	}

	segs = new seg_t[numsegs];
	memset (segs, 0, numsegs*sizeof(seg_t));

	data = new BYTE[lumplen];
	map->Read(ML_SEGS, data);

	for (i = 0; i < numsubsectors; ++i)
	{
		subsectors[i].firstline = &segs[(size_t)subsectors[i].firstline];
	}

	// phares: 10/4/98: Vertchanged is an array that represents the vertices.
	// Mark those used by linedefs. A marked vertex is one that is not a
	// candidate for movement further down.

	line = lines;
	for (i = 0; i < numlines ; i++, line++)
	{
		vertchanged[line->v1 - vertexes] = vertchanged[line->v2 - vertexes] = 1;
	}

	try
	{
		for (i = 0; i < numsegs; i++)
		{
			seg_t *li = segs + i;
			segtype *ml = ((segtype *) data) + i;

			int side, linedef;
			line_t *ldef;

			vnum1 = ml->V1();
			vnum2 = ml->V2();

			if (vnum1 >= numvertexes || vnum2 >= numvertexes)
			{
				throw badseg(0, i, MAX(vnum1, vnum2));
			}

			li->v1 = &vertexes[vnum1];
			li->v2 = &vertexes[vnum2];

			segangle = (WORD)LittleShort(ml->angle);

			// phares 10/4/98: In the case of a lineseg that was created by splitting
			// another line, it appears that the line angle is inherited from the
			// father line. Due to roundoff, the new vertex may have been placed 'off
			// the line'. When you get close to such a line, and it is very short,
			// it's possible that the roundoff error causes 'firelines', the thin
			// lines that can draw from screen top to screen bottom occasionally. This
			// is due to all the angle calculations that are done based on the line
			// angle, the angles from the viewer to the vertices, and the viewer's
			// angle in the world. In the case of firelines, the rounded-off position
			// of one of the vertices determines one of these angles, and introduces
			// an error in the scaling factor for mapping textures and determining
			// where on the screen the ceiling and floor spans should be shown. For a
			// fireline, the engine thinks the ceiling bottom and floor top are at the
			// midpoint of the screen. So you get ceilings drawn all the way down to the
			// screen midpoint, and floors drawn all the way up. Thus 'firelines'. The
			// name comes from the original sighting, which involved a fire texture.
			//
			// To correct this, reset the vertex that was added so that it sits ON the
			// split line.
			//
			// To know which of the two vertices was added, its number is greater than
			// that of the last of the author-created vertices. If both vertices of the
			// line were added by splitting, pick the higher-numbered one. Once you've
			// changed a vertex, don't change it again if it shows up in another seg.
			//
			// To determine if there's an error in the first place, find the
			// angle of the line between the two seg vertices. If it's one degree or more
			// off, then move one vertex. This may seem insignificant, but one degree
			// errors _can_ cause firelines.

			DAngle ptp_angle = (li->v2->fPos() - li->v1->fPos()).Angle();
			DAngle seg_angle = AngleToFloat(segangle << 16);
			DAngle delta_angle = absangle(ptp_angle, seg_angle);

			if (delta_angle >= 1.)
			{
				double dis = (li->v2->fPos() - li->v1->fPos()).Length();
				DVector2 delta = seg_angle.ToVector(dis);
				if ((vnum2 > vnum1) && (vertchanged[vnum2] == 0))
				{
					li->v2->set(li->v1->fPos() + delta);
					vertchanged[vnum2] = 1; // this was changed
				}
				else if (vertchanged[vnum1] == 0)
				{
					li->v1->set(li->v2->fPos() - delta);
					vertchanged[vnum1] = 1; // this was changed
				}
			}

			linedef = LittleShort(ml->linedef);
			if ((unsigned)linedef >= (unsigned)numlines)
			{
				throw badseg(1, i, linedef);
			}
			ldef = &lines[linedef];
			li->linedef = ldef;
			side = LittleShort(ml->side);
			if ((unsigned)(ldef->sidedef[side] - sides) >= (unsigned)numsides)
			{
				throw badseg(2, i, int(ldef->sidedef[side] - sides));
			}
			li->sidedef = ldef->sidedef[side];
			li->frontsector = ldef->sidedef[side]->sector;

			// killough 5/3/98: ignore 2s flag if second sidedef missing:
			if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
			{
				li->backsector = ldef->sidedef[side^1]->sector;
			}
			else
			{
				li->backsector = 0;
				ldef->flags &= ~ML_TWOSIDED;
			}
		}
	}
	catch (const badseg &bad) // the preferred way is to catch by (const) reference.
	{
		switch (bad.badtype)
		{
		case 0:
			Printf ("Seg %d references a nonexistant vertex %d (max %d).\n", bad.badsegnum, bad.baddata, numvertexes);
			break;

		case 1:
			Printf ("Seg %d references a nonexistant linedef %d (max %d).\n", bad.badsegnum, bad.baddata, numlines);
			break;

		case 2:
			Printf ("The linedef for seg %d references a nonexistant sidedef %d (max %d).\n", bad.badsegnum, bad.baddata, numsides);
			break;
		}
		Printf ("The BSP will be rebuilt.\n");
		delete[] segs;
		delete[] subsectors;
		delete[] nodes;
		ForceNodeBuild = true;
	}

	delete[] vertchanged; // phares 10/4/98
	delete[] data;
}